

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::Next(DBIter *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  Slice in_stack_ffffffffffffffe8;
  DBIter *this_00;
  
  this_00 = *(DBIter **)(in_FS_OFFSET + 0x28);
  if ((in_RDI[4].field_2._M_local_buf[4] & 1U) == 0) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x8e,"virtual void leveldb::(anonymous namespace)::DBIter::Next()");
  }
  if (*(int *)&in_RDI[4].field_2 == 1) {
    *(undefined4 *)&in_RDI[4].field_2 = 0;
    uVar1 = (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x10))();
    if ((uVar1 & 1) == 0) {
      (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x18))();
    }
    else {
      (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x30))();
    }
    uVar1 = (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x10))();
    if ((uVar1 & 1) == 0) {
      in_RDI[4].field_2._M_local_buf[4] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(in_RDI)
      ;
      goto LAB_00d25ae0;
    }
  }
  else {
    auVar2 = (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x40))();
    in_stack_ffffffffffffffe8 = ExtractUserKey(auVar2._0_8_);
    SaveKey((DBIter *)in_stack_ffffffffffffffe8.data_,auVar2._8_8_,auVar2._0_8_);
    (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x30))();
    uVar1 = (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x10))();
    if ((uVar1 & 1) == 0) {
      in_RDI[4].field_2._M_local_buf[4] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear(in_RDI)
      ;
      goto LAB_00d25ae0;
    }
  }
  FindNextUserEntry(this_00,in_stack_ffffffffffffffe8.size_._7_1_,
                    (string *)in_stack_ffffffffffffffe8.data_);
LAB_00d25ae0:
  if (*(DBIter **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBIter::Next() {
  assert(valid_);

  if (direction_ == kReverse) {  // Switch directions?
    direction_ = kForward;
    // iter_ is pointing just before the entries for this->key(),
    // so advance into the range of entries for this->key() and then
    // use the normal skipping code below.
    if (!iter_->Valid()) {
      iter_->SeekToFirst();
    } else {
      iter_->Next();
    }
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
    // saved_key_ already contains the key to skip past.
  } else {
    // Store in saved_key_ the current key so we skip it below.
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);

    // iter_ is pointing to current key. We can now safely move to the next to
    // avoid checking current key.
    iter_->Next();
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
  }

  FindNextUserEntry(true, &saved_key_);
}